

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::SearchBigFixed(int iters,int nbytes,SearchImpl *search)

{
  string t;
  string s;
  string regexp;
  StringPiece local_30;
  
  StopBenchmarkTiming();
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((ulong)&s,(char)((long)nbytes / 2));
  std::operator+(&t,"^",&s);
  std::operator+(&regexp,&t,".*$");
  std::__cxx11::string::~string((string *)&t);
  t._M_dataplus._M_p = (pointer)&t.field_2;
  t._M_string_length = 0;
  t.field_2._M_local_buf[0] = '\0';
  MakeText(&t,(int)((long)nbytes / 2));
  std::__cxx11::string::append((string *)&s);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_30.ptr_ = s._M_dataplus._M_p;
  local_30.length_ = (int)s._M_string_length;
  (*search)(iters,regexp._M_dataplus._M_p,&local_30,kUnanchored,true);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&regexp);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void SearchBigFixed(int iters, int nbytes, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  s.append(nbytes/2, 'x');
  string regexp = "^" + s + ".*$";
  string t;
  MakeText(&t, nbytes/2);
  s += t;
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp.c_str(), s, Prog::kUnanchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}